

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O1

long __thiscall
glcts::anon_unknown_0::UniformLocMixWithImplicitMaxArray::Run
          (UniformLocMixWithImplicitMaxArray *this)

{
  int _arraySize;
  ulong uVar1;
  int _arraySize_00;
  ulong uVar2;
  long lVar3;
  Loc _location;
  Loc _location_00;
  GLint max;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  uniforms;
  int tests [3];
  int local_3f4;
  UniformValueGenerator *local_3f0;
  vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
  local_3e8;
  ExplicitUniformLocationCaseBase *local_3d0;
  int local_3c4 [3];
  UniformType local_3b8;
  UniformType local_328;
  UniformType local_298;
  Uniform local_208;
  
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_ExplicitUniformLocationCaseBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x826e,&local_3f4);
  local_3c4[0] = 0;
  local_3c4[1] = 3;
  local_3c4[2] = local_3f4 + -4;
  local_3f0 = &(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator;
  lVar3 = 0;
  uVar2 = 0;
  local_3d0 = &this->super_ExplicitUniformLocationCaseBase;
  do {
    local_3e8.
    super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3e8.
    super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_3e8.
    super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    _arraySize = local_3c4[lVar3];
    if (0 < _arraySize) {
      UniformType::UniformType(&local_3b8,0x1406,_arraySize);
      Uniform::Uniform(&local_208,local_3f0,&local_3b8,(Loc)ZEXT812(0),(DefOccurence)0x0,
                       (DefOccurence)0x5);
      std::
      vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
      ::push_back(&local_3e8,&local_208);
      Uniform::~Uniform(&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8.refStrType._M_dataplus._M_p != &local_3b8.refStrType.field_2) {
        operator_delete(local_3b8.refStrType._M_dataplus._M_p,
                        local_3b8.refStrType.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b8.strType._M_dataplus._M_p != &local_3b8.strType.field_2) {
        operator_delete(local_3b8.strType._M_dataplus._M_p,
                        local_3b8.strType.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
      ::~vector(&local_3b8.childTypes);
      if (local_3b8.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_3b8.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_3b8.arraySizesSegmented.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_3b8.arraySizesSegmented.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_3e8.
          super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].type.arraySize +
          local_3e8.
          super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].location.super_LayoutSpecifierBase.val !=
          _arraySize) {
        __assert_fail("uniforms[uniforms.size() - 1].location.val + uniforms[uniforms.size() - 1].type.arraySize == tests[test]"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                      ,0x9ba,
                      "virtual long glcts::(anonymous namespace)::UniformLocMixWithImplicitMaxArray::Run()"
                     );
      }
    }
    _arraySize_00 = (local_3f4 + -3) - _arraySize;
    if (_arraySize_00 != 0 && _arraySize <= local_3f4 + -3) {
      UniformType::UniformType(&local_298,0x1406,_arraySize_00);
      _location.super_LayoutSpecifierBase.numSys = Dec;
      _location.super_LayoutSpecifierBase.occurence.occurence = ALL_SH;
      _location.super_LayoutSpecifierBase.val = _arraySize + 3;
      Uniform::Uniform(&local_208,local_3f0,&local_298,_location,(DefOccurence)0x0,(DefOccurence)0x5
                      );
      std::
      vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
      ::push_back(&local_3e8,&local_208);
      Uniform::~Uniform(&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.refStrType._M_dataplus._M_p != &local_298.refStrType.field_2) {
        operator_delete(local_298.refStrType._M_dataplus._M_p,
                        local_298.refStrType.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.strType._M_dataplus._M_p != &local_298.strType.field_2) {
        operator_delete(local_298.strType._M_dataplus._M_p,
                        local_298.strType.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
      ::~vector(&local_298.childTypes);
      if (local_298.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_298.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_298.arraySizesSegmented.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_298.arraySizesSegmented.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_3e8.
          super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].type.arraySize +
          local_3e8.
          super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].location.super_LayoutSpecifierBase.val !=
          local_3f4) {
        __assert_fail("uniforms[uniforms.size() - 1].location.val + uniforms[uniforms.size() - 1].type.arraySize == max"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                      ,0x9c4,
                      "virtual long glcts::(anonymous namespace)::UniformLocMixWithImplicitMaxArray::Run()"
                     );
      }
    }
    UniformType::UniformType(&local_328,0x1406,3);
    _location_00.super_LayoutSpecifierBase.occurence.occurence = NONE_SH;
    _location_00.super_LayoutSpecifierBase.val = 1999999;
    _location_00.super_LayoutSpecifierBase.numSys = Dec;
    Uniform::Uniform(&local_208,local_3f0,&local_328,_location_00,(DefOccurence)0x0,
                     (DefOccurence)0x0);
    std::
    vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
    ::push_back(&local_3e8,&local_208);
    Uniform::~Uniform(&local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328.refStrType._M_dataplus._M_p != &local_328.refStrType.field_2) {
      operator_delete(local_328.refStrType._M_dataplus._M_p,
                      local_328.refStrType.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328.strType._M_dataplus._M_p != &local_328.strType.field_2) {
      operator_delete(local_328.strType._M_dataplus._M_p,
                      local_328.strType.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<glcts::(anonymous_namespace)::UniformType,_std::allocator<glcts::(anonymous_namespace)::UniformType>_>
    ::~vector(&local_328.childTypes);
    if (local_328.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_328.arraySizesSegmented.super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_328.arraySizesSegmented.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_328.arraySizesSegmented.
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    uVar1 = ExplicitUniformLocationCaseBase::doRun(local_3d0,&local_3e8);
    uVar2 = uVar2 | uVar1;
    std::
    vector<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
    ::~vector(&local_3e8);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  return uVar2;
}

Assistant:

virtual long Run()
	{
		long ret = NO_ERROR;

		GLint max;
		glGetIntegerv(GL_MAX_UNIFORM_LOCATIONS, &max);

		const int implicitCount = 3;

		int tests[3] = { 0, 3, max - 4 };

		for (int test = 0; test < 3; test++)
		{
			std::vector<Uniform> uniforms;

			//for performance reasons fill-up all avaliable locations with an unused arrays.
			if (tests[test] > 0)
			{
				//[0..test - 1]
				uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_FLOAT, tests[test]), Loc::C(0),
										   DefOccurence::ALL_SH, DefOccurence::NONE_SH));
				assert(uniforms[uniforms.size() - 1].location.val + uniforms[uniforms.size() - 1].type.arraySize ==
					   tests[test]);
			}

			if (tests[test] < max - implicitCount)
			{
				//[test + 3 ..max]
				uniforms.push_back(
					Uniform(uniformValueGenerator, UniformType(GL_FLOAT, max - implicitCount - tests[test]),
							Loc::C(tests[test] + implicitCount), DefOccurence::ALL_SH, DefOccurence::NONE_SH));
				assert(uniforms[uniforms.size() - 1].location.val + uniforms[uniforms.size() - 1].type.arraySize ==
					   max);
			}
			uniforms.push_back(Uniform(uniformValueGenerator, UniformType(GL_FLOAT, implicitCount), Loc::Implicit()));
			ret |= doRun(uniforms);
		}
		return ret;
	}